

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

void __thiscall
ncnn::Deconvolution::cut_padding
          (Deconvolution *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar5 = this->pad_left;
  iVar7 = this->pad_right;
  if (((iVar7 < 1 && iVar5 < 1) && (iVar4 = this->pad_top, iVar4 < 1)) &&
     (iVar3 = this->pad_bottom, iVar3 < 1)) {
    if ((this->output_w < 1) || (this->output_h < 1)) {
      if (top_blob == top_blob_bordered) {
        return;
      }
      piVar1 = top_blob_bordered->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar1 = top_blob_bordered->refcount;
      top_blob->data = top_blob_bordered->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = top_blob_bordered->elemsize;
      top_blob->elempack = top_blob_bordered->elempack;
      top_blob->allocator = top_blob_bordered->allocator;
      iVar5 = top_blob_bordered->w;
      iVar7 = top_blob_bordered->h;
      iVar4 = top_blob_bordered->d;
      top_blob->dims = top_blob_bordered->dims;
      top_blob->w = iVar5;
      top_blob->h = iVar7;
      top_blob->d = iVar4;
      top_blob->c = top_blob_bordered->c;
      top_blob->cstep = top_blob_bordered->cstep;
      return;
    }
    iVar6 = top_blob_bordered->w - this->output_w;
    iVar2 = top_blob_bordered->h - this->output_h;
    if ((iVar4 == -0xe9 || (iVar7 == -0xe9 || iVar5 == -0xe9)) || iVar3 == -0xe9) {
      iVar4 = iVar2 / 2;
      iVar3 = iVar2 - iVar4;
      iVar5 = iVar6 / 2;
      iVar7 = iVar6 - iVar5;
    }
    else {
      if ((iVar4 != -0xea && (iVar7 != -0xea && iVar5 != -0xea)) && iVar3 != -0xea) {
        return;
      }
      iVar3 = iVar2 / 2;
      iVar4 = iVar2 - iVar3;
      iVar7 = iVar6 / 2;
      iVar5 = iVar6 - iVar7;
    }
  }
  else {
    iVar4 = this->pad_top;
    iVar3 = this->pad_bottom;
  }
  copy_cut_border(top_blob_bordered,top_blob,iVar4,iVar3,iVar5,iVar7,opt);
  return;
}

Assistant:

void Deconvolution::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
    }
    else if (output_w > 0 && output_h > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}